

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
 __thiscall
nanojson3::internal::
key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
::
operate_emplace<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_insert_option)1,std::__cxx11::string_const&,int&>
          (key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,int *value)

{
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  _Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  void *__storage;
  _Uninitialized<std::nullptr_t,_true> _Var3;
  pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
  pVar4;
  _Variadic_union<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
  local_88;
  undefined1 local_68;
  _Variadic_union<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
  local_58;
  undefined1 local_38;
  
  _Var1 = operate_find<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_find_option)0,__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,nanojson3::json>*,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>,std::__cxx11::string>
                    (this,*(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
                            **)this,
                     *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
                       **)(this + 8),key);
  if (_Var1._M_current ==
      *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        **)(this + 8)) {
    local_88._M_rest._0_8_ = (undefined8)value;
    local_58._M_rest._0_8_ = (undefined8)key;
    std::
    vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
    ::
    emplace_back<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<int&>>
              ((vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
                *)this,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,(tuple<int_&> *)&local_88);
    _Var1._M_current =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
          *)(*(long *)(this + 8) + -0x50);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    _Var3._M_storage = (void *)(long)*value;
    local_38 = 3;
    local_68 = 3;
    local_88._M_rest._0_8_ = (undefined8)_Var3._M_storage;
    local_58._M_rest._0_8_ = (undefined8)_Var3._M_storage;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                         *)&local_58);
    if (*(__index_type *)
         ((long)&((_Var1._M_current)->second).value_.
                 super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                 .
                 super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
         + 0x20) == '\x03') {
      *(void **)&((_Var1._M_current)->second).value_.
                 super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                 .
                 super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           = _Var3._M_storage;
    }
    else {
      std::
      variant<std::monostate,decltype(nullptr),bool,long_long,long_double,std::__cxx11::string,std::vector<nanojson3::json,std::allocator<nanojson3::json>>,nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>>
      ::emplace<3ul,long_long>
                ((variant<std::monostate,decltype(nullptr),bool,long_long,long_double,std::__cxx11::string,std::vector<nanojson3::json,std::allocator<nanojson3::json>>,nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>>
                  *)&(_Var1._M_current)->second,(longlong *)&local_88);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                         *)&local_88);
    uVar2 = 0;
  }
  pVar4._8_8_ = uVar2;
  pVar4.first._M_current = _Var1._M_current;
  return pVar4;
}

Assistant:

[[nodiscard]] std::pair<iterator, bool> operate_emplace(Key&& key, Value&&... value)
            {
                if (auto it = operate_find(begin(), end(), key); it != end())
                {
                    if constexpr (on_already_exists == or_assign) it->second = mapped_type(std::forward<decltype(value)>(value)...);
                    return {it, false};
                }
                else
                {
                    base_container::emplace_back(std::piecewise_construct, std::forward_as_tuple(std::forward<decltype(key)>(key)), std::forward_as_tuple(std::forward<decltype(value)>(value)...));
                    return {base_container::end() - 1, true};
                }
            }